

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implementation.hpp
# Opt level: O2

size_t __thiscall
boost::unordered::detail::
table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>,_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_boost::hash<int>,_std::equal_to<int>_>_>
::min_buckets_for_size
          (table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>,_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_boost::hash<int>,_std::equal_to<int>_>_>
           *this,size_t size)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  size_t in_stack_00000008;
  
  if (0.001 <= this->mlf_) {
    auVar2._8_4_ = (int)(size >> 0x20);
    auVar2._0_8_ = size;
    auVar2._12_4_ = 0x45300000;
    floor(((auVar2._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)size) - 4503599627370496.0)) / (double)this->mlf_);
    sVar1 = next_prime(in_stack_00000008);
    return sVar1;
  }
  __assert_fail("mlf_ >= minimum_max_load_factor",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/unordered/detail/implementation.hpp"
                ,0xbd3,
                "std::size_t boost::unordered::detail::table<boost::unordered::detail::map<std::allocator<std::pair<const int, boost::tuples::tuple<bool, unsigned int>>>, int, boost::tuples::tuple<bool, unsigned int>, boost::hash<int>, std::equal_to<int>>>::min_buckets_for_size(std::size_t) const [Types = boost::unordered::detail::map<std::allocator<std::pair<const int, boost::tuples::tuple<bool, unsigned int>>>, int, boost::tuples::tuple<bool, unsigned int>, boost::hash<int>, std::equal_to<int>>]"
               );
}

Assistant:

std::size_t min_buckets_for_size(std::size_t size) const
        {
          BOOST_ASSERT(mlf_ >= minimum_max_load_factor);

          using namespace std;

          // From insert/emplace requirements:
          //
          // size <= mlf_ * count
          // => count >= size / mlf_
          //
          // Or from rehash post-condition:
          //
          // count >= size / mlf_

          return policy::new_bucket_count(
            boost::unordered::detail::double_to_size(
              floor(static_cast<double>(size) / static_cast<double>(mlf_)) +
              1));
        }